

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O0

HeapType __thiscall wasm::anon_unknown_0::BrandTypeIterator::operator*(BrandTypeIterator *this)

{
  const_reference this_00;
  allocator<wasm::Field> local_79;
  __normal_iterator<const_wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo_*,_std::vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>_>
  local_78;
  __normal_iterator<const_wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo_*,_std::vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>_>
  local_70;
  FieldList local_68;
  Struct local_50;
  Field local_38;
  Array local_28;
  BrandTypeIterator *local_18;
  BrandTypeIterator *this_local;
  
  local_18 = this;
  if ((this->useArray & 1U) == 0) {
    local_70._M_current =
         (FieldInfo *)
         std::
         vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
         ::begin(&this->fields);
    local_78._M_current =
         (FieldInfo *)
         std::
         vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
         ::end(&this->fields);
    std::allocator<wasm::Field>::allocator(&local_79);
    std::vector<wasm::Field,std::allocator<wasm::Field>>::
    vector<__gnu_cxx::__normal_iterator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo_const*,std::vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>>>,void>
              ((vector<wasm::Field,std::allocator<wasm::Field>> *)&local_68,local_70,local_78,
               &local_79);
    Struct::Struct(&local_50,&local_68);
    HeapType::HeapType((HeapType *)&this_local,&local_50);
    Struct::~Struct(&local_50);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_68);
    std::allocator<wasm::Field>::~allocator(&local_79);
  }
  else {
    this_00 = std::
              vector<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
              ::operator[](&this->fields,0);
    local_38 = wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo::operator_cast_to_Field
                         ((FieldInfo *)this_00);
    Array::Array(&local_28,local_38);
    HeapType::HeapType((HeapType *)&this_local,&local_28);
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType operator*() const {
    if (useArray) {
      return Array(fields[0]);
    }
    return Struct(std::vector<Field>(fields.begin(), fields.end()));
  }